

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O1

nh_bool curses_get_ext_cmd(char *cmd_out,char **namelist,char **desclist,wchar_t listlen)

{
  nh_menuitem_conflict *pnVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  wchar_t *results;
  char *pcVar7;
  bool bVar8;
  char *pcVar9;
  wchar_t icount;
  char *__format;
  char cVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  extcmd_hook_args hpa;
  char prompt [128];
  char cbuf [128];
  char buf [256];
  wchar_t local_2c4;
  nh_menuitem_conflict *local_2c0;
  int local_2a4;
  char **local_270;
  char **local_268;
  wchar_t local_260;
  char local_258 [32];
  char local_238 [4];
  undefined1 auStack_234 [124];
  char local_1b8 [128];
  char local_138 [264];
  
  local_270 = namelist;
  local_268 = desclist;
  local_260 = listlen;
  if (settings.extmenu == '\0') {
    hooked_curses_getlin("extended command: (? for help)",cmd_out,ext_cmd_getlin_hook,&local_270);
    cVar10 = *cmd_out;
    pcVar7 = cmd_out;
    if (cVar10 == '\0') {
      bVar18 = true;
    }
    else {
      pcVar9 = cmd_out + 1;
      bVar8 = true;
      do {
        if (cVar10 == '\t') {
          cVar10 = ' ';
        }
        bVar18 = cVar10 == ' ';
        if (!(bool)(bVar8 & bVar18)) {
          *pcVar7 = cVar10;
          pcVar7 = pcVar7 + 1;
        }
        cVar10 = *pcVar9;
        pcVar9 = pcVar9 + 1;
        bVar8 = bVar18;
      } while (cVar10 != '\0');
    }
    pcVar7[-(ulong)(byte)(cmd_out < pcVar7 & bVar18)] = '\0';
    return *cmd_out != '\x1b' && *cmd_out != '\0';
  }
  local_2c0 = (nh_menuitem_conflict *)malloc(0xa78);
  __ptr = malloc((long)listlen * 4 + 4);
  local_1b8[0] = '\0';
  uVar4 = (ulong)(uint)listlen;
  local_2c4 = L'\n';
  lVar15 = 0;
  local_2a4 = 0;
  iVar16 = 0;
  do {
    iVar13 = (int)lVar15;
    if (listlen < L'\x01') {
      iVar14 = 0;
    }
    else {
      uVar17 = 0;
      iVar14 = 0;
      do {
        if ((iVar13 == 0) || (iVar3 = strncmp(namelist[uVar17],local_1b8,(long)iVar13), iVar3 == 0))
        {
          lVar5 = (long)iVar14;
          iVar14 = iVar14 + 1;
          *(int *)((long)__ptr + lVar5 * 4) = (int)uVar17;
          sVar6 = strlen(desclist[uVar17]);
          if ((ulong)(long)local_2a4 < sVar6) {
            local_2a4 = (int)sVar6;
            sprintf(local_258,"%%-%ds",(ulong)(local_2a4 + 0xf));
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar4 != uVar17);
    }
    *(undefined4 *)((long)__ptr + (long)iVar14 * 4) = 0xffffffff;
    if (iVar14 == 1) {
      if (L'\0' < listlen) {
        uVar17 = 0;
        goto LAB_0010a1fd;
      }
      break;
    }
    if (listlen < L'\x01') {
      wVar12 = L'\0';
      bVar18 = true;
      icount = L'\0';
    }
    else {
      uVar17 = 0;
      icount = L'\0';
      iVar3 = 0;
      wVar11 = L'\0';
      do {
        lVar5 = (long)*(int *)((long)__ptr + uVar17 * 4);
        wVar12 = wVar11;
        if (lVar5 < 0) break;
        wVar12 = (wchar_t)namelist[lVar5][iVar13];
        if (iVar3 != 0 && (wVar11 != wVar12 || iVar14 < 0x12)) {
          sprintf(local_138,local_258,local_238);
          if (local_2c4 <= icount) {
            local_2c4 = local_2c4 * 2;
            local_2c0 = (nh_menuitem_conflict *)realloc(local_2c0,(long)local_2c4 * 0x10c);
          }
          pnVar1 = local_2c0 + icount;
          pnVar1->id = wVar11;
          pnVar1->role = MI_NORMAL;
          pnVar1->accel = (char)wVar11;
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,local_138);
          icount = icount + L'\x01';
          iVar3 = 0;
        }
        if (iVar14 < 0x12 || iVar3 == 0) {
          iVar2 = *(int *)((long)__ptr + uVar17 * 4);
          pcVar7 = namelist[iVar2];
          pcVar9 = desclist[iVar2];
          __format = "%s [%s]";
LAB_00109ff1:
          sprintf(local_238,__format,pcVar7,pcVar9);
        }
        else {
          if (iVar3 == 1) {
            pcVar7 = namelist[*(int *)((long)__ptr + uVar17 * 4 + -4)];
            pcVar9 = namelist[*(int *)((long)__ptr + uVar17 * 4)];
            __format = "%s or %s";
            goto LAB_00109ff1;
          }
          sVar6 = strlen(local_238);
          builtin_strncpy(local_238 + sVar6," or ",4);
          auStack_234[sVar6] = 0;
          strcat(local_238,namelist[*(int *)((long)__ptr + uVar17 * 4)]);
        }
        iVar3 = iVar3 + 1;
        uVar17 = uVar17 + 1;
        wVar11 = wVar12;
      } while (uVar4 != uVar17);
      bVar18 = iVar3 == 0;
    }
    if (!bVar18) {
      sprintf(local_138,local_258,local_238);
      if (local_2c4 <= icount) {
        local_2c4 = local_2c4 * 2;
        local_2c0 = (nh_menuitem_conflict *)realloc(local_2c0,(long)local_2c4 * 0x10c);
      }
      pnVar1 = local_2c0 + icount;
      pnVar1->id = wVar12;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = (char)wVar12;
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,local_138);
      icount = icount + L'\x01';
    }
    results = (wchar_t *)malloc((long)icount * 4);
    sprintf(local_238,"Extended Command: %s",local_1b8);
    wVar12 = curses_display_menu(local_2c0,icount,local_238,L'\x01',results);
    if (wVar12 == L'\x01') {
      if (iVar13 < 0x7f) {
        lVar5 = (long)iVar13;
        lVar15 = lVar5 + 1;
        local_1b8[lVar5] = (char)*results;
        local_1b8[lVar5 + 1] = '\0';
      }
      else {
        iVar16 = -1;
      }
    }
    else {
      iVar16 = -(uint)(iVar13 == 0);
      lVar15 = 0;
    }
    free(results);
  } while (iVar16 == 0);
  goto LAB_0010a250;
  while (uVar17 = uVar17 + 1, uVar4 != uVar17) {
LAB_0010a1fd:
    iVar14 = strncmp(namelist[uVar17],local_1b8,(long)iVar13);
    if (iVar14 == 0) {
      iVar16 = (int)uVar17;
      break;
    }
  }
LAB_0010a250:
  free(__ptr);
  free(local_2c0);
  if (iVar16 != -1) {
    strcpy(cmd_out,namelist[iVar16]);
  }
  return iVar16 != -1;
}

Assistant:

nh_bool curses_get_ext_cmd(char *cmd_out, const char **namelist,
			   const char **desclist, int listlen)
{
	int i;
	struct extcmd_hook_args hpa = {namelist, desclist, listlen};

	if (settings.extmenu) {
	    i = extcmd_via_menu(namelist, desclist, listlen);
	    if (i == -1)
		return FALSE;
	    strcpy(cmd_out, namelist[i]);
	    return TRUE;
	}

	/* maybe a runtime option? */
	hooked_curses_getlin("extended command: (? for help)", cmd_out,
			     ext_cmd_getlin_hook, &hpa);
	mungspaces(cmd_out);
	if (cmd_out[0] == 0 || cmd_out[0] == '\033')
	    return FALSE;
	
	return TRUE;
}